

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_io.c
# Opt level: O0

ALLEGRO_BITMAP * al_load_bitmap_flags(char *filename,int flags)

{
  _Bool _Var1;
  Handler *pHVar2;
  int in_ESI;
  char *in_RDI;
  ALLEGRO_BITMAP *ret;
  Handler *h;
  char *ext;
  undefined8 in_stack_ffffffffffffffd0;
  undefined1 create_if_not;
  char *in_stack_ffffffffffffffd8;
  char *local_20;
  ALLEGRO_BITMAP *local_8;
  
  create_if_not = (undefined1)((ulong)in_stack_ffffffffffffffd0 >> 0x38);
  local_20 = al_identify_bitmap(in_stack_ffffffffffffffd8);
  if ((local_20 == (char *)0x0) && (local_20 = strrchr(in_RDI,0x2e), local_20 == (char *)0x0)) {
    _Var1 = _al_trace_prefix(filename,flags,ext,h._4_4_,(char *)ret);
    if (_Var1) {
      _al_trace_suffix("Could not identify bitmap %s!",in_RDI);
    }
    local_8 = (ALLEGRO_BITMAP *)0x0;
  }
  else {
    pHVar2 = find_handler(in_stack_ffffffffffffffd8,(_Bool)create_if_not);
    if ((pHVar2 == (Handler *)0x0) || (pHVar2->loader == (ALLEGRO_IIO_LOADER_FUNCTION)0x0)) {
      _Var1 = _al_trace_prefix(filename,flags,ext,h._4_4_,(char *)ret);
      if (_Var1) {
        _al_trace_suffix("No handler for bitmap %s!",in_RDI);
      }
      local_8 = (ALLEGRO_BITMAP *)0x0;
    }
    else {
      local_8 = (*pHVar2->loader)(in_RDI,in_ESI);
      if ((local_8 == (ALLEGRO_BITMAP *)0x0) &&
         (_Var1 = _al_trace_prefix(filename,flags,ext,h._4_4_,(char *)ret), _Var1)) {
        _al_trace_suffix("Failed loading bitmap %s with %s handler.\n",in_RDI,local_20);
      }
    }
  }
  return local_8;
}

Assistant:

ALLEGRO_BITMAP *al_load_bitmap_flags(const char *filename, int flags)
{
   const char *ext;
   Handler *h;
   ALLEGRO_BITMAP *ret;

   ext = al_identify_bitmap(filename);
   if (!ext) {
      ext = strrchr(filename, '.');
      if (!ext) {
         ALLEGRO_ERROR("Could not identify bitmap %s!", filename);
         return NULL;
      }
   }

   h = find_handler(ext, false);
   if (h && h->loader) {
      ret = h->loader(filename, flags);
      if (!ret)
         ALLEGRO_ERROR("Failed loading bitmap %s with %s handler.\n",
            filename, ext);
   }
   else {
      ALLEGRO_ERROR("No handler for bitmap %s!", filename);
      ret = NULL;
   }

   return ret;
}